

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HasPackageReferences(cmGeneratorTarget *this)

{
  bool bVar1;
  byte local_56;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  
  local_18 = this;
  bVar1 = IsInBuildSystem(this);
  local_56 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"VS_PACKAGE_REFERENCES",&local_41);
    local_20 = GetProperty(this,&local_40);
    cmValue::operator->[abi_cxx11_(&local_20);
    local_56 = std::__cxx11::string::empty();
    local_56 = local_56 ^ 0xff;
  }
  this_local._7_1_ = local_56 & 1;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::HasPackageReferences() const
{
  return this->IsInBuildSystem() &&
    !this->GetProperty("VS_PACKAGE_REFERENCES")->empty();
}